

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat4 * dja::mat4::homogeneous::translation(vec3 *dir)

{
  float_t fVar1;
  float_t fVar2;
  float_t fVar3;
  mat4 *in_RDI;
  
  fVar1 = dir->x;
  fVar2 = dir->y;
  fVar3 = dir->z;
  in_RDI->m[0].x = 1.0;
  in_RDI->m[0].y = 0.0;
  in_RDI->m[0].z = 0.0;
  in_RDI->m[0].w = fVar1;
  in_RDI->m[1].x = 0.0;
  in_RDI->m[1].y = 1.0;
  in_RDI->m[1].z = 0.0;
  in_RDI->m[1].w = fVar2;
  in_RDI->m[2].x = 0.0;
  in_RDI->m[2].y = 0.0;
  in_RDI->m[2].z = 1.0;
  in_RDI->m[2].w = fVar3;
  in_RDI->m[3].x = 0.0;
  in_RDI->m[3].y = 0.0;
  in_RDI->m[3].z = 0.0;
  in_RDI->m[3].w = 1.0;
  return in_RDI;
}

Assistant:

mat4 mat4::homogeneous::translation(const vec3& dir)
{
    return mat4(1, 0, 0, dir.x,
                0, 1, 0, dir.y,
                0, 0, 1, dir.z,
                0, 0, 0, 1     );
}